

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_converter.cpp
# Opt level: O3

void duckdb::ArrowConverter::ToArrowArray
               (DataChunk *input,ArrowArray *out_array,ClientProperties *options,
               unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
               *extension_type_cast)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  idx_t initial_capacity;
  long lVar3;
  ArrowArray *pAVar4;
  byte bVar5;
  ArrowAppender appender;
  __alloc_node_gen_t __alloc_node_gen;
  ClientProperties local_168;
  vector<duckdb::LogicalType,_true> local_138;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_120;
  ArrowAppender local_e8;
  ArrowArray local_80;
  
  bVar5 = 0;
  DataChunk::GetTypes(&local_138,input);
  initial_capacity = input->count;
  paVar2 = &local_168.time_zone.field_2;
  local_168.time_zone._M_dataplus._M_p = (options->time_zone)._M_dataplus._M_p;
  paVar1 = &(options->time_zone).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.time_zone._M_dataplus._M_p == paVar1) {
    local_168.time_zone.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_168.time_zone.field_2._8_8_ = *(undefined8 *)((long)&(options->time_zone).field_2 + 8);
    local_168.time_zone._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_168.time_zone.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_168.time_zone._M_string_length = (options->time_zone)._M_string_length;
  (options->time_zone)._M_dataplus._M_p = (pointer)paVar1;
  (options->time_zone)._M_string_length = 0;
  (options->time_zone).field_2._M_local_buf[0] = '\0';
  local_168.arrow_offset_size = options->arrow_offset_size;
  local_168.arrow_use_list_view = options->arrow_use_list_view;
  local_168.produce_arrow_string_view = options->produce_arrow_string_view;
  local_168.arrow_lossless_conversion = options->arrow_lossless_conversion;
  local_168._36_4_ = *(undefined4 *)&options->field_0x24;
  local_168.client_context.ptr = (options->client_context).ptr;
  local_80.length = (int64_t)&local_120;
  local_120._M_buckets = (__buckets_ptr)0x0;
  local_120._M_bucket_count = (extension_type_cast->_M_h)._M_bucket_count;
  local_120._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_120._M_element_count = (extension_type_cast->_M_h)._M_element_count;
  local_120._M_rehash_policy._M_max_load_factor =
       (extension_type_cast->_M_h)._M_rehash_policy._M_max_load_factor;
  local_120._M_rehash_policy._4_4_ =
       *(undefined4 *)&(extension_type_cast->_M_h)._M_rehash_policy.field_0x4;
  local_120._M_rehash_policy._M_next_resize =
       (extension_type_cast->_M_h)._M_rehash_policy._M_next_resize;
  local_120._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>,false>>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_80.length,&extension_type_cast->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_false>_>_>
              *)&local_80);
  ArrowAppender::ArrowAppender
            (&local_e8,&local_138,initial_capacity,&local_168,
             (unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
              *)&local_120);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.time_zone._M_dataplus._M_p != paVar2) {
    operator_delete(local_168.time_zone._M_dataplus._M_p);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_138);
  ArrowAppender::Append(&local_e8,input,0,input->count,input->count);
  ArrowAppender::Finalize(&local_80,&local_e8);
  pAVar4 = &local_80;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    out_array->length = pAVar4->length;
    pAVar4 = (ArrowArray *)((long)pAVar4 + ((ulong)bVar5 * -2 + 1) * 8);
    out_array = (ArrowArray *)((long)out_array + (ulong)bVar5 * -0x10 + 8);
  }
  ArrowAppender::~ArrowAppender(&local_e8);
  return;
}

Assistant:

void ArrowConverter::ToArrowArray(
    DataChunk &input, ArrowArray *out_array, ClientProperties options,
    const unordered_map<idx_t, const shared_ptr<ArrowTypeExtensionData>> &extension_type_cast) {
	ArrowAppender appender(input.GetTypes(), input.size(), std::move(options), extension_type_cast);
	appender.Append(input, 0, input.size(), input.size());
	*out_array = appender.Finalize();
}